

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropymode.c
# Opt level: O0

void av1_setup_past_independence(AV1_COMMON *cm)

{
  long in_RDI;
  AV1_COMMON *in_stack_00000010;
  
  av1_clearall_segfeatures((segmentation *)0x6d2b25);
  if (*(long *)(*(long *)(in_RDI + 0xe8) + 0x50) != 0) {
    memset(*(void **)(*(long *)(in_RDI + 0xe8) + 0x50),0,
           (long)(*(int *)(*(long *)(in_RDI + 0xe8) + 0x104) *
                 *(int *)(*(long *)(in_RDI + 0xe8) + 0x108)));
  }
  av1_set_default_ref_deltas((int8_t *)(*(long *)(in_RDI + 0xe8) + 0x5cc));
  av1_set_default_mode_deltas((int8_t *)(*(long *)(in_RDI + 0xe8) + 0x5d4));
  set_default_lf_deltas((loopfilter *)0x6d2bb1);
  av1_default_coef_probs(cm);
  av1_init_mode_probs((FRAME_CONTEXT *)cm);
  av1_init_mv_probs((AV1_COMMON *)0x6d2bd3);
  *(undefined4 *)(*(long *)(in_RDI + 0x6090) + 0x52f8) = 1;
  av1_setup_frame_contexts(in_stack_00000010);
  return;
}

Assistant:

void av1_setup_past_independence(AV1_COMMON *cm) {
  // Reset the segment feature data to the default stats:
  // Features disabled, 0, with delta coding (Default state).
  av1_clearall_segfeatures(&cm->seg);

  if (cm->cur_frame->seg_map) {
    memset(cm->cur_frame->seg_map, 0,
           (cm->cur_frame->mi_rows * cm->cur_frame->mi_cols));
  }

  // reset mode ref deltas
  av1_set_default_ref_deltas(cm->cur_frame->ref_deltas);
  av1_set_default_mode_deltas(cm->cur_frame->mode_deltas);
  set_default_lf_deltas(&cm->lf);

  av1_default_coef_probs(cm);
  av1_init_mode_probs(cm->fc);
  av1_init_mv_probs(cm);
  cm->fc->initialized = 1;
  av1_setup_frame_contexts(cm);
}